

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

void build_obj_list(wchar_t last,object **list,item_tester tester,olist_detail_t mode)

{
  _Bool _Var1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  uint local_bc;
  object *local_b0;
  char *mention_copy;
  size_t u8len;
  char *mention;
  object *obj;
  char buf [80];
  _Bool quiver;
  wchar_t wStack_28;
  _Bool equip;
  _Bool show_empty;
  _Bool dead;
  _Bool in_term;
  _Bool gold_ok;
  wchar_t i;
  olist_detail_t mode_local;
  item_tester tester_local;
  object **list_local;
  wchar_t last_local;
  
  bVar4 = (mode & OLIST_WINDOW) != OLIST_NONE;
  bVar5 = list != player->upkeep->quiver;
  wStack_28 = L'\0';
  do {
    if (last < wStack_28) {
      return;
    }
    if (list != (object **)0x0) {
      local_b0 = list[wStack_28];
    }
    else {
      local_b0 = slot_object(player,wStack_28);
    }
    _Var1 = object_test(tester,local_b0);
    if ((_Var1) ||
       (((local_b0 != (object *)0x0 && (_Var1 = tval_is_money(local_b0), _Var1)) &&
        ((mode & OLIST_GOLD) != OLIST_NONE)))) {
      if (bVar5) {
        local_bc = (uint)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[wStack_28];
      }
      else {
        local_bc = wStack_28 + L'0';
      }
      strnfmt(items[num_obj].label,0x50,"%c) ",(ulong)local_bc);
LAB_0025f339:
      if (list != (object **)0x0) {
        if (((!bVar4) && ((mode & OLIST_DEATH) == OLIST_NONE)) || (bVar5)) {
          strnfmt(items[num_obj].equip_label,0x50,"%s","");
        }
        else {
          strnfmt((char *)&obj,0x50,"Slot %-9d: ",(ulong)(uint)wStack_28);
          my_strcpy(items[num_obj].equip_label,(char *)&obj,0x50);
        }
      }
      else {
        pcVar2 = equip_mention(player,wStack_28);
        sVar3 = utf8_strlen(pcVar2);
        if (sVar3 < 0xe) {
          strnfmt((char *)&obj,0x50,"%s%*s",pcVar2,(ulong)(0xe - (int)sVar3)," ");
        }
        else {
          pcVar2 = string_make(pcVar2);
          if (0xe < sVar3) {
            utf8_clipto(pcVar2,0xe);
          }
          strnfmt((char *)&obj,0x50,"%s",pcVar2);
          string_free(pcVar2);
        }
        my_strcpy(items[num_obj].equip_label,(char *)&obj,0x50);
      }
      items[num_obj].object = local_b0;
      items[num_obj].key = items[num_obj].label[0];
      num_obj = num_obj + L'\x01';
    }
    else if (((local_b0 == (object *)0x0) && ((mode & OLIST_SEMPTY) != OLIST_NONE)) || (bVar4)) {
      my_strcpy(items[num_obj].label,"   ",0x50);
      goto LAB_0025f339;
    }
    wStack_28 = wStack_28 + L'\x01';
  } while( true );
}

Assistant:

static void build_obj_list(int last, struct object **list, item_tester tester,
						   olist_detail_t mode)
{
	int i;
	bool gold_ok = (mode & OLIST_GOLD) ? true : false;
	bool in_term = (mode & OLIST_WINDOW) ? true : false;
	bool dead = (mode & OLIST_DEATH) ? true : false;
	bool show_empty = (mode & OLIST_SEMPTY) ? true : false;
	bool equip = list ? false : true;
	bool quiver = list == player->upkeep->quiver ? true : false;

	/* Build the object list */
	for (i = 0; i <= last; i++) {
		char buf[80];
		struct object *obj = equip ? slot_object(player, i) : list[i];

		/* Acceptable items get a label */
		if (object_test(tester, obj) ||	(obj && tval_is_money(obj) && gold_ok))
			strnfmt(items[num_obj].label, sizeof(items[num_obj].label), "%c) ",
				quiver ? I2D(i) : all_letters_nohjkl[i]);

		/* Unacceptable items are still sometimes shown */
		else if ((!obj && show_empty) || in_term)
			my_strcpy(items[num_obj].label, "   ",
					  sizeof(items[num_obj].label));

		/* Unacceptable items are skipped in the main window */
		else continue;

		/* Show full slot labels for equipment (or quiver in subwindow) */
		if (equip) {
			const char *mention = equip_mention(player, i);
			size_t u8len = utf8_strlen(mention);

			if (u8len < 14) {
				strnfmt(buf, sizeof(buf), "%s%*s", mention,
					(int)(14 - u8len), " ");
			} else {
				char *mention_copy = string_make(mention);

				if (u8len > 14) {
					utf8_clipto(mention_copy, 14);
				}
				strnfmt(buf, sizeof(buf), "%s", mention_copy);
				string_free(mention_copy);
			}
			my_strcpy(items[num_obj].equip_label, buf,
					  sizeof(items[num_obj].equip_label));
		} else if ((in_term || dead) && quiver) {
			strnfmt(buf, sizeof(buf), "Slot %-9d: ", i);
			my_strcpy(items[num_obj].equip_label, buf,
					  sizeof(items[num_obj].equip_label));
		} else {
			strnfmt(items[num_obj].equip_label,
				sizeof(items[num_obj].equip_label), "%s", "");
		}

		/* Save the object */
		items[num_obj].object = obj;
		items[num_obj].key = (items[num_obj].label)[0];
		num_obj++;
	}
}